

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O3

void Aig_ManDumpVerilog(Aig_Man_t *p,char *pFileName)

{
  void **ppvVar1;
  void *pvVar2;
  bool bVar3;
  long lVar4;
  Vec_Ptr_t *__ptr;
  Vec_Ptr_t *pVVar5;
  FILE *__s;
  ulong uVar6;
  int iVar7;
  long lVar8;
  char *pcVar9;
  int iVar10;
  uint uVar11;
  char *pcVar12;
  Aig_Obj_t *pAVar13;
  uint uVar14;
  ulong uVar15;
  
  if (p->nObjs[3] == 0) {
    puts("Aig_ManDumpBlif(): AIG manager does not have POs.");
    return;
  }
  lVar4 = (long)p->vCos->nSize;
  if (lVar4 < 1) {
    pAVar13 = (Aig_Obj_t *)0x0;
  }
  else {
    lVar8 = 0;
    pAVar13 = (Aig_Obj_t *)0x0;
    do {
      if ((*(uint *)((*(ulong *)((long)p->vCos->pArray[lVar8] + 8) & 0xfffffffffffffffe) + 0x18) & 7
          ) == 1) {
        pAVar13 = p->pConst1;
      }
      lVar8 = lVar8 + 1;
    } while (lVar4 != lVar8);
  }
  uVar14 = 1;
  __ptr = Aig_ManDfs(p,1);
  (p->pConst1->field_5).iData = 0;
  pVVar5 = p->vCis;
  if (0 < pVVar5->nSize) {
    lVar4 = 0;
    do {
      ppvVar1 = pVVar5->pArray + lVar4;
      lVar4 = lVar4 + 1;
      *(int *)((long)*ppvVar1 + 0x28) = (int)lVar4;
      pVVar5 = p->vCis;
    } while (lVar4 < pVVar5->nSize);
    uVar14 = (int)lVar4 + 1;
  }
  pVVar5 = p->vCos;
  if (0 < pVVar5->nSize) {
    lVar4 = 0;
    do {
      *(uint *)((long)pVVar5->pArray[lVar4] + 0x28) = uVar14 + (int)lVar4;
      lVar4 = lVar4 + 1;
      pVVar5 = p->vCos;
    } while (lVar4 < pVVar5->nSize);
    uVar14 = uVar14 + (int)lVar4;
  }
  if (0 < __ptr->nSize) {
    lVar4 = 0;
    do {
      *(uint *)((long)__ptr->pArray[lVar4] + 0x28) = uVar14 + (int)lVar4;
      lVar4 = lVar4 + 1;
    } while (lVar4 < __ptr->nSize);
    uVar14 = uVar14 + (int)lVar4;
  }
  uVar15 = 1;
  if (1 < uVar14) {
    uVar15 = 0;
    uVar14 = uVar14 - 1;
    do {
      uVar15 = (ulong)((int)uVar15 + 1);
      bVar3 = 9 < uVar14;
      uVar14 = uVar14 / 10;
    } while (bVar3);
  }
  __s = fopen(pFileName,"w");
  fwrite("// Verilog file written by procedure Aig_ManDumpVerilog()\n",0x3a,1,__s);
  pcVar9 = "test";
  if (p->pName != (char *)0x0) {
    pcVar9 = p->pName;
  }
  pcVar12 = "module %s ( clock";
  if (p->nRegs == 0) {
    pcVar12 = "module %s (";
  }
  fprintf(__s,pcVar12,pcVar9);
  uVar14 = p->nRegs;
  uVar6 = (ulong)uVar14;
  if ((int)uVar14 < p->nObjs[2]) {
    lVar4 = 0;
    do {
      if (p->vCis->nSize <= lVar4) goto LAB_006de5e9;
      pcVar9 = ",";
      if ((int)uVar6 == 0 && (int)lVar4 == 0) {
        pcVar9 = "";
      }
      fprintf(__s,"%s n%0*d",pcVar9,uVar15,(ulong)*(uint *)((long)p->vCis->pArray[lVar4] + 0x28));
      lVar4 = lVar4 + 1;
      uVar14 = p->nRegs;
      uVar6 = (ulong)(int)uVar14;
    } while (lVar4 < (long)((long)p->nObjs[2] - uVar6));
  }
  if ((int)uVar14 < p->nObjs[3]) {
    lVar4 = 0;
    do {
      if (p->vCos->nSize <= lVar4) goto LAB_006de5e9;
      fprintf(__s,", n%0*d",uVar15,(ulong)*(uint *)((long)p->vCos->pArray[lVar4] + 0x28));
      lVar4 = lVar4 + 1;
    } while (lVar4 < (long)p->nObjs[3] - (long)p->nRegs);
  }
  fwrite(" );\n",4,1,__s);
  if (p->nRegs == 0) {
    uVar6 = 0;
  }
  else {
    fwrite("input clock;\n",0xd,1,__s);
    uVar6 = (ulong)(uint)p->nRegs;
  }
  if ((int)uVar6 < p->nObjs[2]) {
    lVar4 = 0;
    do {
      if (p->vCis->nSize <= lVar4) goto LAB_006de5e9;
      fprintf(__s,"input n%0*d;\n",uVar15,(ulong)*(uint *)((long)p->vCis->pArray[lVar4] + 0x28));
      lVar4 = lVar4 + 1;
      uVar6 = (ulong)p->nRegs;
    } while (lVar4 < (long)((long)p->nObjs[2] - uVar6));
  }
  if ((int)uVar6 < p->nObjs[3]) {
    lVar4 = 0;
    do {
      if (p->vCos->nSize <= lVar4) goto LAB_006de5e9;
      fprintf(__s,"output n%0*d;\n",uVar15,(ulong)*(uint *)((long)p->vCos->pArray[lVar4] + 0x28));
      lVar4 = lVar4 + 1;
      uVar6 = (ulong)p->nRegs;
    } while (lVar4 < (long)((long)p->nObjs[3] - uVar6));
  }
  if (0 < (int)uVar6) {
    iVar10 = 0;
    do {
      iVar7 = (p->nObjs[3] - (int)uVar6) + iVar10;
      if ((((iVar7 < 0) || (p->vCos->nSize <= iVar7)) ||
          (uVar14 = (p->nObjs[2] - (int)uVar6) + iVar10, (int)uVar14 < 0)) ||
         (p->vCis->nSize <= (int)uVar14)) goto LAB_006de5e9;
      fprintf(__s,"reg n%0*d;\n",uVar15,(ulong)*(uint *)((long)p->vCis->pArray[uVar14] + 0x28));
      iVar10 = iVar10 + 1;
      uVar14 = p->nRegs;
      uVar6 = (ulong)uVar14;
    } while (iVar10 < (int)uVar14);
    if (0 < (int)uVar14) {
      iVar10 = 0;
      do {
        uVar14 = (p->nObjs[3] - (int)uVar6) + iVar10;
        if ((((int)uVar14 < 0) || (p->vCos->nSize <= (int)uVar14)) ||
           ((iVar7 = (p->nObjs[2] - (int)uVar6) + iVar10, iVar7 < 0 || (p->vCis->nSize <= iVar7))))
        goto LAB_006de5e9;
        fprintf(__s,"wire n%0*d;\n",uVar15,(ulong)*(uint *)((long)p->vCos->pArray[uVar14] + 0x28));
        iVar10 = iVar10 + 1;
        uVar6 = (ulong)(uint)p->nRegs;
      } while (iVar10 < p->nRegs);
    }
  }
  iVar10 = __ptr->nSize;
  if (0 < iVar10) {
    lVar4 = 0;
    do {
      fprintf(__s,"wire n%0*d;\n",uVar15,(ulong)*(uint *)((long)__ptr->pArray[lVar4] + 0x28));
      lVar4 = lVar4 + 1;
      iVar10 = __ptr->nSize;
    } while (lVar4 < iVar10);
  }
  if (pAVar13 != (Aig_Obj_t *)0x0) {
    fprintf(__s,"wire n%0*d;\n",uVar15,(ulong)(uint)(pAVar13->field_5).iData);
    fprintf(__s,"assign n%0*d = 1\'b1;\n",uVar15,(ulong)(uint)(pAVar13->field_5).iData);
    iVar10 = __ptr->nSize;
  }
  if (0 < iVar10) {
    lVar4 = 0;
    do {
      pvVar2 = __ptr->pArray[lVar4];
      pcVar9 = " ";
      if ((*(ulong *)((long)pvVar2 + 8) & 1) != 0) {
        pcVar9 = "~";
      }
      pcVar12 = " ";
      if ((*(ulong *)((long)pvVar2 + 0x10) & 1) != 0) {
        pcVar12 = "~";
      }
      fprintf(__s,"assign n%0*d = %sn%0*d & %sn%0*d;\n",uVar15,(ulong)*(uint *)((long)pvVar2 + 0x28)
              ,pcVar9,uVar15,
              (ulong)*(uint *)((*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe) + 0x28),pcVar12,
              uVar15,(ulong)*(uint *)((*(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe) + 0x28)
             );
      lVar4 = lVar4 + 1;
    } while (lVar4 < __ptr->nSize);
  }
  uVar6 = (ulong)(uint)p->nRegs;
  if (p->nRegs < p->nObjs[3]) {
    lVar4 = 0;
    do {
      if (p->vCos->nSize <= lVar4) goto LAB_006de5e9;
      pvVar2 = p->vCos->pArray[lVar4];
      uVar6 = *(ulong *)((long)pvVar2 + 8);
      pcVar9 = "\r\n\t ";
      if ((uVar6 & 1) != 0) {
        pcVar9 = " & ~";
      }
      fprintf(__s,"assign n%0*d = %sn%0*d;\n",uVar15,(ulong)*(uint *)((long)pvVar2 + 0x28),
              pcVar9 + 3,uVar15,(ulong)*(uint *)((uVar6 & 0xfffffffffffffffe) + 0x28));
      lVar4 = lVar4 + 1;
      uVar6 = (ulong)p->nRegs;
    } while (lVar4 < (long)((long)p->nObjs[3] - uVar6));
  }
  if (0 < (int)uVar6) {
    iVar10 = 0;
    do {
      uVar14 = (p->nObjs[3] - (int)uVar6) + iVar10;
      if ((((int)uVar14 < 0) || (p->vCos->nSize <= (int)uVar14)) ||
         ((iVar7 = (p->nObjs[2] - (int)uVar6) + iVar10, iVar7 < 0 || (p->vCis->nSize <= iVar7))))
      goto LAB_006de5e9;
      pvVar2 = p->vCos->pArray[uVar14];
      uVar6 = *(ulong *)((long)pvVar2 + 8);
      pcVar9 = "\r\n\t ";
      if ((uVar6 & 1) != 0) {
        pcVar9 = " & ~";
      }
      fprintf(__s,"assign n%0*d = %sn%0*d;\n",uVar15,(ulong)*(uint *)((long)pvVar2 + 0x28),
              pcVar9 + 3,uVar15,(ulong)*(uint *)((uVar6 & 0xfffffffffffffffe) + 0x28));
      iVar10 = iVar10 + 1;
      uVar14 = p->nRegs;
      uVar6 = (ulong)uVar14;
    } while (iVar10 < (int)uVar14);
    if (0 < (int)uVar14) {
      iVar10 = 0;
      do {
        uVar14 = (p->nObjs[3] - (int)uVar6) + iVar10;
        if (((((int)uVar14 < 0) || (p->vCos->nSize <= (int)uVar14)) ||
            (uVar11 = (p->nObjs[2] - (int)uVar6) + iVar10, (int)uVar11 < 0)) ||
           (p->vCis->nSize <= (int)uVar11)) goto LAB_006de5e9;
        fprintf(__s,"always @ (posedge clock) begin n%0*d <= n%0*d; end\n",uVar15,
                (ulong)*(uint *)((long)p->vCis->pArray[uVar11] + 0x28),uVar15,
                (ulong)*(uint *)((long)p->vCos->pArray[uVar14] + 0x28));
        iVar10 = iVar10 + 1;
        uVar14 = p->nRegs;
        uVar6 = (ulong)uVar14;
      } while (iVar10 < (int)uVar14);
      if (0 < (int)uVar14) {
        iVar10 = 0;
        do {
          iVar7 = (p->nObjs[3] - (int)uVar6) + iVar10;
          if (((iVar7 < 0) || (p->vCos->nSize <= iVar7)) ||
             ((uVar14 = (p->nObjs[2] - (int)uVar6) + iVar10, (int)uVar14 < 0 ||
              (p->vCis->nSize <= (int)uVar14)))) {
LAB_006de5e9:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          fprintf(__s,"initial begin n%0*d <= 1\'b0; end\n",uVar15,
                  (ulong)*(uint *)((long)p->vCis->pArray[uVar14] + 0x28));
          iVar10 = iVar10 + 1;
          uVar6 = (ulong)(uint)p->nRegs;
        } while (iVar10 < p->nRegs);
      }
    }
  }
  fwrite("endmodule\n\n",0xb,1,__s);
  fclose(__s);
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  return;
}

Assistant:

void Aig_ManDumpVerilog( Aig_Man_t * p, char * pFileName )
{
    FILE * pFile;
    Vec_Ptr_t * vNodes;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo, * pConst1 = NULL;
    int i, nDigits, Counter = 0;
    if ( Aig_ManCoNum(p) == 0 )
    {
        printf( "Aig_ManDumpBlif(): AIG manager does not have POs.\n" );
        return;
    }
    // check if constant is used
    Aig_ManForEachCo( p, pObj, i )
        if ( Aig_ObjIsConst1(Aig_ObjFanin0(pObj)) )
            pConst1 = Aig_ManConst1(p);
    // collect nodes in the DFS order
    vNodes = Aig_ManDfs( p, 1 );
    // assign IDs to objects
    Aig_ManConst1(p)->iData = Counter++;
    Aig_ManForEachCi( p, pObj, i )
        pObj->iData = Counter++;
    Aig_ManForEachCo( p, pObj, i )
        pObj->iData = Counter++;
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        pObj->iData = Counter++;
    nDigits = Abc_Base10Log( Counter );
    // write the file
    pFile = fopen( pFileName, "w" );
    fprintf( pFile, "// Verilog file written by procedure Aig_ManDumpVerilog()\n" );
//    fprintf( pFile, "// http://www.eecs.berkeley.edu/~alanmi/abc/\n" );
    if ( Aig_ManRegNum(p) )
        fprintf( pFile, "module %s ( clock", p->pName? p->pName: "test" );
    else
        fprintf( pFile, "module %s (", p->pName? p->pName: "test" );
    Aig_ManForEachPiSeq( p, pObj, i )
        fprintf( pFile, "%s n%0*d", ((Aig_ManRegNum(p) || i)? ",":""), nDigits, pObj->iData );
    Aig_ManForEachPoSeq( p, pObj, i )
        fprintf( pFile, ", n%0*d", nDigits, pObj->iData );
    fprintf( pFile, " );\n" );

    // write PIs
    if ( Aig_ManRegNum(p) )
        fprintf( pFile, "input clock;\n" );
    Aig_ManForEachPiSeq( p, pObj, i )
        fprintf( pFile, "input n%0*d;\n", nDigits, pObj->iData );
    // write POs
    Aig_ManForEachPoSeq( p, pObj, i )
        fprintf( pFile, "output n%0*d;\n", nDigits, pObj->iData );
    // write latches
    if ( Aig_ManRegNum(p) )
    {
    Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
        fprintf( pFile, "reg n%0*d;\n", nDigits, pObjLo->iData );
    Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
        fprintf( pFile, "wire n%0*d;\n", nDigits, pObjLi->iData );
    }
    // write nodes
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        fprintf( pFile, "wire n%0*d;\n", nDigits, pObj->iData );
    if ( pConst1 )
        fprintf( pFile, "wire n%0*d;\n", nDigits, pConst1->iData );
    // write nodes
    if ( pConst1 )
        fprintf( pFile, "assign n%0*d = 1\'b1;\n", nDigits, pConst1->iData );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
    {
        fprintf( pFile, "assign n%0*d = %sn%0*d & %sn%0*d;\n", 
            nDigits, pObj->iData,
            !Aig_ObjFaninC0(pObj) ? " " : "~", nDigits, Aig_ObjFanin0(pObj)->iData, 
            !Aig_ObjFaninC1(pObj) ? " " : "~", nDigits, Aig_ObjFanin1(pObj)->iData
            );
    }
    // write POs
    Aig_ManForEachPoSeq( p, pObj, i )
    {
        fprintf( pFile, "assign n%0*d = %sn%0*d;\n", 
            nDigits, pObj->iData,
            !Aig_ObjFaninC0(pObj) ? " " : "~", nDigits, Aig_ObjFanin0(pObj)->iData );
    }
    if ( Aig_ManRegNum(p) )
    {
        Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
        {
            fprintf( pFile, "assign n%0*d = %sn%0*d;\n", 
                nDigits, pObjLi->iData,
                !Aig_ObjFaninC0(pObjLi) ? " " : "~", nDigits, Aig_ObjFanin0(pObjLi)->iData );
        }
    }

    // write initial state
    if ( Aig_ManRegNum(p) )
    {
        Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
            fprintf( pFile, "always @ (posedge clock) begin n%0*d <= n%0*d; end\n", 
                 nDigits, pObjLo->iData,
                 nDigits, pObjLi->iData );
        Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
            fprintf( pFile, "initial begin n%0*d <= 1\'b0; end\n", 
                 nDigits, pObjLo->iData );
    }

    fprintf( pFile, "endmodule\n\n" );
    fclose( pFile );
    Vec_PtrFree( vNodes );
}